

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CovergroupType::CovergroupType
          (CovergroupType *this,Compilation *compilation,string_view name,SourceLocation loc,
          CovergroupBodySymbol *body)

{
  (this->super_Type).super_Symbol.kind = CovergroupType;
  (this->super_Type).super_Symbol.name._M_len = name._M_len;
  (this->super_Type).super_Symbol.name._M_str = name._M_str;
  (this->super_Type).super_Symbol.location = loc;
  (this->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Type).super_Symbol.indexInScope = 0;
  (this->super_Type).super_Symbol.parentScope = (Scope *)0x0;
  (this->super_Type).super_Symbol.nextInScope = (Symbol *)0x0;
  (this->super_Type).canonical = &this->super_Type;
  Scope::Scope(&this->super_Scope,compilation,(Symbol *)this);
  (this->sampleArguments).data_ = (pointer)0x0;
  (this->sampleArguments).size_ = 0;
  (this->arguments).data_ = (pointer)0x0;
  (this->arguments).size_ = 0;
  this->body = body;
  (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = false;
  return;
}

Assistant:

CovergroupType::CovergroupType(Compilation& compilation, string_view name, SourceLocation loc,
                               const CovergroupBodySymbol& body) :
    Type(SymbolKind::CovergroupType, name, loc),
    Scope(compilation, this), body(body) {
}